

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

BlockStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::BlockStatement,slang::ast::Statement_const&,slang::ast::StatementBlockKind&,slang::SourceRange_const&>
          (BumpAllocator *this,Statement *args,StatementBlockKind *args_1,SourceRange *args_2)

{
  StatementBlockKind SVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  BlockStatement *pBVar4;
  
  pBVar4 = (BlockStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BlockStatement *)this->endPtr < pBVar4 + 1) {
    pBVar4 = (BlockStatement *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pBVar4 + 1);
  }
  SVar1 = *args_1;
  SVar2 = args_2->startLoc;
  SVar3 = args_2->endLoc;
  (pBVar4->super_Statement).kind = Block;
  (pBVar4->super_Statement).syntax = (StatementSyntax *)0x0;
  (pBVar4->super_Statement).sourceRange.startLoc = SVar2;
  (pBVar4->super_Statement).sourceRange.endLoc = SVar3;
  pBVar4->body = args;
  pBVar4->blockSymbol = (StatementBlockSymbol *)0x0;
  pBVar4->blockKind = SVar1;
  return pBVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }